

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::create_global_symtab_lookup_table(CVmImageLoader *this)

{
  uint uVar1;
  CVmObjPageEntry *pCVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  int iVar6;
  vm_runtime_sym *pvVar7;
  vm_val_t str;
  vm_val_t local_40;
  
  if ((this->runtime_symtab_ != (CVmRuntimeSymbols *)0x0) && (this->reflection_symtab_ == 0)) {
    vVar5 = CVmObjLookupTable::create(0,0x100,(uint)this->runtime_symtab_->cnt_);
    this->reflection_symtab_ = vVar5;
    pvVar4 = sp_;
    pCVar2 = G_obj_table_X.pages_[vVar5 >> 0xc];
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar4->val).obj = vVar5;
    pvVar7 = this->runtime_symtab_->head_;
    if (pvVar7 != (vm_runtime_sym *)0x0) {
      do {
        if (((pvVar7->val).typ != VM_OBJ) ||
           (uVar1 = (pvVar7->val).val.obj,
           iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8
                               ))(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),
                                  CVmObjIntClsMod::metaclass_reg_), iVar6 == 0)) {
          local_40.val.obj = CVmObjString::create(0,pvVar7->sym,pvVar7->len);
          local_40.typ = VM_OBJ;
          CVmObjLookupTable::add_entry
                    ((CVmObjLookupTable *)((long)&pCVar2->ptr_ + (ulong)((vVar5 & 0xfff) * 0x18)),
                     &local_40,&pvVar7->val);
        }
        pvVar7 = pvVar7->nxt;
      } while (pvVar7 != (vm_runtime_sym *)0x0);
    }
    sp_ = sp_ + -1;
  }
  return;
}

Assistant:

void CVmImageLoader::create_global_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime symbol table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_symtab_ == 0)
        return;

    /* 
     *   if we already have a reflection symbol table, there's no need to
     *   create another 
     */
    if (reflection_symtab_ != VM_INVALID_OBJ)
        return;
    
    /* create a LookupTable to hold the symbols */
    reflection_symtab_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_symtab_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_symtab_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_symtab_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_symtab_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;

        /* 
         *   skip intrinsic class modifier objects (for the same reason we
         *   filter these out of firstObj/nextObj iterations: they're not
         *   meaningful objects as far as the program is concerned, so
         *   there's no reason for the program to see them) 
         */
        if (sym->val.typ == VM_OBJ
            && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ sym->val.val.obj))
        {
            /* it's an intrinsic class modifier - skip it */
            continue;
        }

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* 
         *   add it to the lookup table - the symbol string is the key, and
         *   the symbol's value is the lookup entry value 
         */
        lookup->add_entry(vmg_ &str, &sym->val);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}